

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::convertToString_abi_cxx11_(string *__return_storage_ptr__,soul *this,IdentifierPath *name)

{
  string local_30;
  
  IdentifierPath::toString_abi_cxx11_(&local_30,(IdentifierPath *)this);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString (const IdentifierPath& name)     { return Program::stripRootNamespaceFromQualifiedPath (name.toString()); }